

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall
cmServer::WriteResponse
          (cmServer *this,cmConnection *connection,cmServerResponse *response,DebugInfo *debug)

{
  bool bVar1;
  Value *pVVar2;
  string *local_140;
  string local_120;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_78;
  undefined1 local_50 [8];
  Value obj;
  DebugInfo *debug_local;
  cmServerResponse *response_local;
  cmConnection *connection_local;
  cmServer *this_local;
  
  obj.limit_ = (ptrdiff_t)debug;
  bVar1 = cmServerResponse::IsComplete(response);
  if (bVar1) {
    cmServerResponse::Data((Value *)local_50,response);
    Json::Value::Value(&local_78,&response->Cookie);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_78);
    Json::Value::~Value(&local_78);
    bVar1 = cmServerResponse::IsError(response);
    if (bVar1) {
      local_140 = &kERROR_TYPE_abi_cxx11_;
    }
    else {
      local_140 = &kREPLY_TYPE_abi_cxx11_;
    }
    Json::Value::Value(&local_b0,local_140);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kTYPE_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_b0);
    Json::Value::~Value(&local_b0);
    Json::Value::Value(&local_d8,&response->Type);
    pVVar2 = Json::Value::operator[]((Value *)local_50,&kREPLY_TO_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_d8);
    Json::Value::~Value(&local_d8);
    bVar1 = cmServerResponse::IsError(response);
    if (bVar1) {
      cmServerResponse::ErrorMessage_abi_cxx11_(&local_120,response);
      Json::Value::Value(&local_100,&local_120);
      pVVar2 = Json::Value::operator[]((Value *)local_50,&kERROR_MESSAGE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_100);
      Json::Value::~Value(&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    WriteJsonObject(this,connection,(Value *)local_50,(DebugInfo *)obj.limit_);
    Json::Value::~Value((Value *)local_50);
    return;
  }
  __assert_fail("response.IsComplete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                ,0x17f,
                "void cmServer::WriteResponse(cmConnection *, const cmServerResponse &, const DebugInfo *) const"
               );
}

Assistant:

void cmServer::WriteResponse(cmConnection* connection,
                             const cmServerResponse& response,
                             const DebugInfo* debug) const
{
  assert(response.IsComplete());

  Json::Value obj = response.Data();
  obj[kCOOKIE_KEY] = response.Cookie;
  obj[kTYPE_KEY] = response.IsError() ? kERROR_TYPE : kREPLY_TYPE;
  obj[kREPLY_TO_KEY] = response.Type;
  if (response.IsError()) {
    obj[kERROR_MESSAGE_KEY] = response.ErrorMessage();
  }

  this->WriteJsonObject(connection, obj, debug);
}